

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# truncated_normal_dist.hpp
# Opt level: O0

basic_istream<char,_std::char_traits<char>_> *
trng::operator>>(basic_istream<char,_std::char_traits<char>_> *in,param_type *P)

{
  bool bVar1;
  fmtflags __fmtfl;
  _Ios_Fmtflags _Var2;
  basic_istream<char,_std::char_traits<char>_> *pbVar3;
  undefined8 *in_RSI;
  param_type *in_RDI;
  fmtflags flags;
  float b;
  float a;
  float sigma;
  float mu;
  ios_base *this;
  param_type *this_00;
  undefined8 local_44;
  undefined8 local_3c;
  undefined8 local_34;
  float local_20;
  float local_1c;
  float local_18;
  float local_14;
  undefined8 *local_10;
  param_type *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  __fmtfl = Catch::clara::std::ios_base::flags
                      ((ios_base *)((long)&in_RDI->mu_ + *(long *)(*(long *)in_RDI + -0x18)));
  this = (ios_base *)((long)&local_8->mu_ + *(long *)(*(long *)local_8 + -0x18));
  _Var2 = Catch::clara::std::operator|(_S_dec,_S_fixed);
  _Var2 = Catch::clara::std::operator|(_Var2,_S_left);
  Catch::clara::std::ios_base::flags(this,_Var2);
  this_00 = local_8;
  utility::delim('\0');
  pbVar3 = utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)this_00,
                               (delim_c *)this);
  std::istream::operator>>((istream *)pbVar3,&local_14);
  utility::delim('\0');
  pbVar3 = utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)this_00,
                               (delim_c *)this);
  std::istream::operator>>((istream *)pbVar3,&local_18);
  utility::delim('\0');
  pbVar3 = utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)this_00,
                               (delim_c *)this);
  std::istream::operator>>((istream *)pbVar3,&local_1c);
  utility::delim('\0');
  pbVar3 = utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)this_00,
                               (delim_c *)this);
  std::istream::operator>>((istream *)pbVar3,&local_20);
  utility::delim('\0');
  utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)this_00,(delim_c *)this);
  bVar1 = std::ios::operator_cast_to_bool
                    ((ios *)((long)&local_8->mu_ + *(long *)(*(long *)local_8 + -0x18)));
  if (bVar1) {
    truncated_normal_dist<float>::param_type::param_type
              (this_00,(result_type_conflict1)((ulong)this >> 0x20),SUB84(this,0),0.0,4.5349e-39);
    *local_10 = local_44;
    local_10[1] = local_3c;
    local_10[2] = local_34;
  }
  Catch::clara::std::ios_base::flags
            ((ios_base *)((long)&local_8->mu_ + *(long *)(*(long *)local_8 + -0x18)),__fmtfl);
  return (basic_istream<char,_std::char_traits<char>_> *)local_8;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
          std::basic_istream<char_t, traits_t> &in, param_type &P) {
        float_t mu, sigma, a, b;
        std::ios_base::fmtflags flags(in.flags());
        in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
        in >> utility::delim('(') >> mu >> utility::delim(' ') >> sigma >>
            utility::delim(' ') >> a >> utility::delim(' ') >> b >> utility::delim(')');
        if (in)
          P = param_type(mu, sigma, a, b);
        in.flags(flags);
        return in;
      }